

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPSDESInfo::DeletePrivatePrefix(RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  RTPMemoryManager *pRVar3;
  bool bVar4;
  int iVar5;
  _List_node_base *p_Var6;
  
  p_Var6 = (this->privitems).
           super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var6 == (_List_node_base *)&this->privitems) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      p_Var2 = *(_List_node_base **)((long)(p_Var6[1]._M_next + 2) + 8);
      if ((p_Var2 == (_List_node_base *)prefixlen) &&
         ((p_Var2 == (_List_node_base *)0x0 ||
          (iVar5 = bcmp(prefix,p_Var6[1]._M_next[2]._M_next,(size_t)p_Var2), iVar5 == 0)))) {
        bVar4 = true;
      }
      else {
        p_Var6 = p_Var6->_M_next;
      }
      if (bVar4) goto LAB_0012cacd;
    } while (p_Var6 != (_List_node_base *)&this->privitems);
  }
  iVar5 = -0x39;
  if (bVar4) {
LAB_0012cacd:
    p_Var2 = p_Var6[1]._M_next;
    pRVar3 = (this->super_RTPMemoryObject).mgr;
    if (pRVar3 == (RTPMemoryManager *)0x0) {
      if (p_Var2 != (_List_node_base *)0x0) {
        (**(code **)((long)p_Var2->_M_next + 8))(p_Var2);
      }
    }
    else {
      (**(code **)p_Var2->_M_next)(p_Var2);
      (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,p_Var2);
    }
    psVar1 = &(this->privitems).
              super__List_base<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var6,0x18);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int RTCPSDESInfo::DeletePrivatePrefix(const uint8_t *prefix,size_t prefixlen)
{
	std::list<SDESPrivateItem *>::iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	if (!found)
		return ERR_RTP_SDES_PREFIXNOTFOUND;
	
	RTPDelete(*it,GetMemoryManager());
	privitems.erase(it);
	return 0;
}